

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O0

void initializeContainerNetwork(Container *container)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Verbosity VVar2;
  int iVar3;
  runtime_error *prVar4;
  ulong uVar5;
  char *pcVar6;
  double __x;
  double __x_00;
  double __x_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_920;
  exception *ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  reference local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *command_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_7e0;
  const_iterator local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_788;
  const_iterator local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_710;
  const_iterator local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_700;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6f8;
  const_iterator local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  undefined1 local_688 [8];
  string command;
  string broadcast;
  allocator<char> local_639;
  value_type local_638;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_618;
  const_iterator local_610;
  path local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  undefined1 local_5c0 [8];
  string bridgeFilePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  iterator local_270;
  size_type local_268;
  undefined1 local_260 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined1 local_1e0 [8];
  string containerIp;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  vEthPair;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  undefined1 local_100 [8];
  string suffix;
  string newNetworkNs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  sem_t *local_78;
  sem_t *networkInitSemaphore;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  sem_t *local_18;
  sem_t *networkNsSemaphore;
  Container *container_local;
  
  networkNsSemaphore = (sem_t *)container;
  VVar2 = loguru::current_verbosity_cutoff();
  if (-1 < VVar2) {
    loguru::log(__x);
  }
  local_18 = sem_open("/networkNsSemaphore",0);
  if (local_18 == (sem_t *)0x0) {
    networkInitSemaphore._3_1_ = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"/networkNsSemaphore",&local_59);
    std::operator+(&local_38,"sem_open failed for ",&local_58);
    std::runtime_error::runtime_error(prVar4,(string *)&local_38);
    networkInitSemaphore._3_1_ = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_78 = sem_open("/networkInitSemaphore",0);
  if (local_78 == (sem_t *)0x0) {
    newNetworkNs.field_2._M_local_buf[0xe] = '\x01';
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"/networkInitSemaphore",
               (allocator<char> *)(newNetworkNs.field_2._M_local_buf + 0xf));
    std::operator+(&local_98,"sem_open failed for ",&local_b8);
    std::runtime_error::runtime_error(prVar4,(string *)&local_98);
    newNetworkNs.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string
            ((string *)(suffix.field_2._M_local_buf + 8),(string *)(networkNsSemaphore + 0x28));
  std::__cxx11::string::substr((ulong)local_100,(ulong)(networkNsSemaphore + 0x28));
  std::operator+(&local_160,"veth0@",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&vEthPair.second.field_2 + 8),"veth1@",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
  std::make_pair<std::__cxx11::string,std::__cxx11::string>
            (&local_140,&local_160,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&vEthPair.second.field_2 + 8));
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(networkNsSemaphore + 0xe8),&local_140);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&local_140);
  std::__cxx11::string::~string((string *)(vEthPair.second.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_160);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)((long)&containerIp.field_2 + 8),
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(networkNsSemaphore + 0xe8));
  getContainerVEthIp_abi_cxx11_();
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Obtain IPv4 address for container: FAILED");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  VVar2 = loguru::current_verbosity_cutoff();
  if (-1 < VVar2) {
    __x_00 = (double)std::__cxx11::string::c_str();
    loguru::log(__x_00);
  }
  std::operator+(&local_200,"ip netns add ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8));
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iVar3 = system(pcVar6);
  std::__cxx11::string::~string((string *)&local_200);
  if (iVar3 != -1) {
    sem_post(local_18);
    sem_wait(local_78);
    bridgeFilePath.field_2._M_local_buf[0xf] = '\x01';
    local_378 = &local_370;
    std::operator+(&local_3b8,"ip link add ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&containerIp.field_2 + 8));
    std::operator+(&local_398,&local_3b8," type veth peer name ");
    std::operator+(&local_370,&local_398,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&vEthPair.first.field_2 + 8));
    local_378 = &local_350;
    std::operator+(&local_3f8,"ip link set ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&containerIp.field_2 + 8));
    std::operator+(&local_3d8,&local_3f8," netns ");
    std::operator+(&local_350,&local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8));
    local_378 = &local_330;
    std::operator+(&local_438,"ip link set ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&vEthPair.first.field_2 + 8));
    std::operator+(&local_418,&local_438," master ");
    std::operator+(&local_330,&local_418,&BRIDGE_NAME_abi_cxx11_);
    local_378 = &local_310;
    std::operator+(&local_4b8,"ip netns exec ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8));
    std::operator+(&local_498,&local_4b8," ip addr add ");
    std::operator+(&local_478,&local_498,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
    std::operator+(&local_458,&local_478,"/24 dev ");
    std::operator+(&local_310,&local_458,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&containerIp.field_2 + 8));
    local_378 = &local_2f0;
    std::operator+(&local_518,"ip netns exec ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8));
    std::operator+(&local_4f8,&local_518," ip link set ");
    std::operator+(&local_4d8,&local_4f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&containerIp.field_2 + 8));
    std::operator+(&local_2f0,&local_4d8," up");
    local_378 = &local_2d0;
    std::operator+(&local_538,"ip netns exec ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8));
    std::operator+(&local_2d0,&local_538," ip link set lo up");
    local_378 = &local_2b0;
    std::operator+(&local_558,"ip link set ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&vEthPair.first.field_2 + 8));
    std::operator+(&local_2b0,&local_558," up");
    local_378 = &local_290;
    std::operator+(&local_598,"ip netns exec ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8));
    std::operator+(&local_578,&local_598," ip route add default via ");
    std::operator+(&local_290,&local_578,&BRIDGE_IP_abi_cxx11_);
    bridgeFilePath.field_2._M_local_buf[0xf] = '\0';
    local_270 = &local_370;
    local_268 = 8;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(bridgeFilePath.field_2._M_local_buf + 0xe));
    __l._M_len = local_268;
    __l._M_array = local_270;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_260,__l,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(bridgeFilePath.field_2._M_local_buf + 0xe));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(bridgeFilePath.field_2._M_local_buf + 0xe));
    local_920 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270;
    do {
      local_920 = local_920 + -1;
      std::__cxx11::string::~string((string *)local_920);
    } while (local_920 != &local_370);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    std::__cxx11::string::~string((string *)&local_558);
    std::__cxx11::string::~string((string *)&local_538);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_418);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::operator+(&local_5e0,"/sys/class/net/",&BRIDGE_NAME_abi_cxx11_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
                   &local_5e0,"/bridge");
    std::__cxx11::string::~string((string *)&local_5e0);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_608,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0,
               auto_format);
    bVar1 = std::filesystem::exists(&local_608);
    std::filesystem::__cxx11::path::~path(&local_608);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_618._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_260);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_610,&local_618);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_638,"iptables --policy FORWARD ACCEPT",&local_639);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_260,local_610,&local_638);
      std::__cxx11::string::~string((string *)&local_638);
      std::allocator<char>::~allocator(&local_639);
      std::__cxx11::string::string
                ((string *)(command.field_2._M_local_buf + 8),(string *)&BRIDGE_IP_abi_cxx11_);
      std::__cxx11::string::pop_back();
      std::__cxx11::string::push_back((char)&command + '\x18');
      std::operator+(&local_6e8,"iptables -t nat -A POSTROUTING -s ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&command.field_2 + 8));
      std::operator+(&local_6c8,&local_6e8,"/24 ! -o ");
      std::operator+(&local_6a8,&local_6c8,&BRIDGE_NAME_abi_cxx11_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688,
                     &local_6a8," -j MASQUERADE");
      std::__cxx11::string::~string((string *)&local_6a8);
      std::__cxx11::string::~string((string *)&local_6c8);
      std::__cxx11::string::~string((string *)&local_6e8);
      local_6f8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_260);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_6f0,&local_6f8);
      local_700 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_260,local_6f0,(value_type *)local_688);
      local_710._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_260);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_708,&local_710);
      std::operator+(&local_770,"ip addr add ",&BRIDGE_IP_abi_cxx11_);
      std::operator+(&local_750,&local_770,"/24 brd + dev ");
      std::operator+(&local_730,&local_750,&BRIDGE_NAME_abi_cxx11_);
      local_778 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_260,local_708,&local_730);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_770);
      local_788._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_260);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_780,&local_788);
      std::operator+(&local_7c8,"ip link set ",&BRIDGE_NAME_abi_cxx11_);
      std::operator+(&local_7a8,&local_7c8," up");
      local_7d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_260,local_780,&local_7a8);
      std::__cxx11::string::~string((string *)&local_7a8);
      std::__cxx11::string::~string((string *)&local_7c8);
      local_7e0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_260);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_7d8,&local_7e0);
      std::operator+(&local_820,"ip link add name ",&BRIDGE_NAME_abi_cxx11_);
      std::operator+(&local_800,&local_820," type bridge");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_260,local_7d8,&local_800);
      std::__cxx11::string::~string((string *)&local_800);
      std::__cxx11::string::~string((string *)&local_820);
      std::__cxx11::string::~string((string *)local_688);
      std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
    }
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_260);
    command_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_260);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&command_1);
      if (!bVar1) {
        sem_post(local_78);
        VVar2 = loguru::current_verbosity_cutoff();
        if (-1 < VVar2) {
          loguru::log(__x_01);
        }
        std::__cxx11::string::~string((string *)local_5c0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_260);
        std::__cxx11::string::~string((string *)local_1e0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&containerIp.field_2 + 8));
        std::__cxx11::string::~string((string *)local_100);
        std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
        return;
      }
      local_848 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      iVar3 = system(pcVar6);
      if (iVar3 == -1) break;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_888,"Execute command ",local_848);
    std::operator+(&local_868,&local_888,": FAILED");
    std::runtime_error::runtime_error(prVar4,(string *)&local_868);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_240,"Create namespace ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8));
  std::operator+(&local_220,&local_240,": FAILED");
  std::runtime_error::runtime_error(prVar4,(string *)&local_220);
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void initializeContainerNetwork(Container* container)
{
    LOG_F(INFO, "Initializing container network environment");
    try
    {
        auto* networkNsSemaphore = sem_open(NETWORK_NS_SEM_NAME, 0);
        if (networkNsSemaphore == SEM_FAILED)
            throw std::runtime_error("sem_open failed for " + std::string(NETWORK_NS_SEM_NAME));
        auto* networkInitSemaphore = sem_open(NETWORK_INIT_SEM_NAME, 0);
        if (networkInitSemaphore == SEM_FAILED)
            throw std::runtime_error("sem_open failed for " + std::string(NETWORK_INIT_SEM_NAME));

        std::string newNetworkNs = container->id;
        // Takes the first 9 characters of the container's ID as the suffix
        // for the names of the veth pair since a valid interface name contains
        // less than 16 characters
        std::string suffix = container->id.substr(0, 9);
        container->vEthPair = std::make_pair("veth0@" + suffix, "veth1@" + suffix);
        auto vEthPair = container->vEthPair;

        std::string containerIp = getContainerVEthIp();
        if (containerIp.empty())
            throw std::runtime_error("Obtain IPv4 address for container: FAILED");
        LOG_F(INFO, "Container IP: %s", containerIp.c_str());

        // Adds the container's ID as a new network namespace
        if (system(("ip netns add " + newNetworkNs).c_str()) == -1)
            throw std::runtime_error("Create namespace " + newNetworkNs + ": FAILED");
        // Unblocks the thread that is attempting to mount /var/run/netns/<new-network-ns>
        sem_post(networkNsSemaphore);
//        sem_post(sem_open(NETWORK_NS_SEM_NAME, 0));
        // Blocks itself until the container's registers its namespace in setUpNetworkNamespace()
        sem_wait(networkInitSemaphore);
//        sem_wait(sem_open(NETWORK_INIT_SEM_NAME, 0));
        std::vector<std::string> commands = {
                // Creates a veth pair
                "ip link add " +  vEthPair.first + " type veth peer name " + vEthPair.second,
                // Moves one end of the veth pair to the new namespace
                "ip link set " + vEthPair.first + " netns " + newNetworkNs,
                // Moves the other end of the veth pair to the bridge
                "ip link set " + vEthPair.second + " master " + BRIDGE_NAME,
                // Assigns an IPv4 address to the first interface in the veth pair
                "ip netns exec " + newNetworkNs + " ip addr add " + containerIp + "/24 dev " + vEthPair.first,
                // Ups veth0
                "ip netns exec " + newNetworkNs + " ip link set " + vEthPair.first + " up",
                // Ups the container's localhost
                "ip netns exec " + newNetworkNs + " ip link set lo up",
                // Ups veth1
                "ip link set " + vEthPair.second + " up",
                // Adds the bridge as the default gateway
                "ip netns exec " + newNetworkNs + " ip route add default via " + BRIDGE_IP
        };

        // Checks if the bridge 'kapsel' already exists
        std::string bridgeFilePath = "/sys/class/net/" + BRIDGE_NAME + "/bridge";
        if (!std::filesystem::exists(bridgeFilePath))
        {
            // Changes the policy on IP table
            // FIXME There might exist another solution
            // From: https://serverfault.com/questions/694889/cannot-ping-linux-network-namespace-within-the-same-subnet
            commands.insert(commands.begin(), "iptables --policy FORWARD ACCEPT");
            // Enable sending requests and getting responses to/from internet
            // From: https://dev.to/polarbit/how-docker-container-networking-works-mimic-it-using-linux-network-namespaces-9mj
            std::string broadcast = BRIDGE_IP;
            broadcast.pop_back();
            broadcast.push_back('1');
            std::string command = "iptables -t nat -A POSTROUTING -s " + broadcast + "/24 ! -o " + BRIDGE_NAME + " -j MASQUERADE";
            commands.insert(commands.begin(), command);
            // Assigns an IP address to the bridge
            commands.insert(commands.begin(), "ip addr add " + BRIDGE_IP + "/24 brd + dev " + BRIDGE_NAME);
            // Ups the bridge interface
            commands.insert(commands.begin(), "ip link set " + BRIDGE_NAME + " up");
            // Creates a network bridge
            commands.insert(commands.begin(), "ip link add name " + BRIDGE_NAME + " type bridge");
        }

        for (const auto& command : commands)
        {
            if (system(command.c_str()) == -1)
                throw std::runtime_error("Execute command " + command + ": FAILED");
        }

        sem_post(networkInitSemaphore);
//        sem_post(sem_open(NETWORK_NS_SEM_NAME, 0));
        LOG_F(INFO, "Initialize container network environment: SUCCESS");
    }
    catch (std::exception& ex)
    {
        LOG_F(ERROR, "Initialize container network environment: FAILED");
        LOG_F(ERROR, "%s", ex.what());
    }
}